

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O1

void __thiscall
boost::wrapexcept<boost::xpressive::regex_error>::copy_from
          (wrapexcept<boost::xpressive::regex_error> *this,exception *p)

{
  error_info_container *peVar1;
  error_info_container *peVar2;
  char *pcVar3;
  int iVar4;
  char cVar5;
  
  peVar1 = (p->data_).px_;
  peVar2 = (this->super_regex_error).super_exception.data_.px_;
  if (peVar2 != (error_info_container *)0x0) {
    cVar5 = (**(code **)(*(long *)peVar2 + 0x20))();
    if (cVar5 != '\0') {
      (this->super_regex_error).super_exception.data_.px_ = (error_info_container *)0x0;
    }
  }
  (this->super_regex_error).super_exception.data_.px_ = peVar1;
  if (peVar1 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x18))(peVar1);
  }
  iVar4 = p->throw_column_;
  (this->super_regex_error).super_exception.throw_line_ = p->throw_line_;
  (this->super_regex_error).super_exception.throw_column_ = iVar4;
  pcVar3 = p->throw_file_;
  (this->super_regex_error).super_exception.throw_function_ = p->throw_function_;
  (this->super_regex_error).super_exception.throw_file_ = pcVar3;
  return;
}

Assistant:

void copy_from( boost::exception const* p )
    {
        static_cast<boost::exception&>( *this ) = *p;
    }